

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_test.cpp
# Opt level: O1

void __thiscall Spectrum_Blackbody_Test::TestBody(Spectrum_Blackbody_Test *this)

{
  int iVar1;
  int iVar2;
  float fVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  long lVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  float fVar9;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  float local_60 [3];
  float local_54;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  float local_3c;
  double local_38;
  
  lVar6 = 8;
  do {
    fVar9 = 0.0;
    if (0.0 < *(float *)(&UNK_00575e1c + lVar6)) {
      fVar3 = *(float *)(&UNK_00575e18 + lVar6) * 1e-09;
      fVar9 = (1.9864457e-25 / (*(float *)(&UNK_00575e1c + lVar6) * fVar3 * 1.3806487e-23)) *
              1.442695;
      auVar8 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
      fVar9 = fVar9 - auVar8._0_4_;
      auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar9),
                               ZEXT416(0x3e679a0b));
      auVar4 = vfmadd213ss_fma(auVar4,ZEXT416((uint)fVar9),ZEXT416(0x3f321004));
      auVar4 = vfmadd213ss_fma(auVar4,ZEXT416((uint)fVar9),ZEXT416(0x3f800000));
      iVar2 = (int)auVar8._0_4_ + -0x7f + (auVar4._0_4_ >> 0x17);
      fVar9 = -1.0;
      if ((-0x7f < iVar2) && (fVar9 = INFINITY, iVar2 < 0x80)) {
        fVar9 = (float)(iVar2 * 0x800000 + 0x3f800000U | auVar4._0_4_ & 0x807fffff) + -1.0;
      }
      fVar9 = 1.1910428e-16 / (fVar3 * fVar3 * fVar3 * fVar3 * fVar3 * fVar9);
      if (NAN(fVar9)) goto LAB_002fa623;
    }
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar8 = vandps_avx512vl(ZEXT416((uint)(fVar9 - *(float *)((long)&DAT_00575e20 + lVar6))),auVar8
                            );
    local_60[0] = auVar8._0_4_ / *(float *)((long)&DAT_00575e20 + lVar6);
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_3f50624dd2f1a9fc;
    testing::internal::CmpHelperLT<float,double>
              (local_50,"err(Blackbody(lambda, T), LeExpected)",".001",local_60,(double *)&local_68)
    ;
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      pcVar7 = "";
      if (local_48.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_48.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum_test.cpp"
                 ,0x24,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar6 = lVar6 + 0xc;
  } while (lVar6 != 0x38);
  lVar6 = 0;
  do {
    iVar2 = *(int *)((long)&DAT_00575e50 + lVar6);
    local_54 = (float)iVar2;
    local_3c = (0.002897772 / (float)iVar2) * 1e+09;
    local_38 = (double)local_3c * 1.01;
    if (iVar2 < 1) {
      local_68.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((ulong)local_68.ptr_._4_4_ << 0x20);
LAB_002fa301:
      fVar9 = 0.0;
    }
    else {
      fVar3 = (float)((double)local_3c * 0.99) * 1e-09;
      fVar9 = (1.9864457e-25 / (fVar3 * 1.3806487e-23 * local_54)) * 1.442695;
      auVar8 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
      fVar9 = fVar9 - auVar8._0_4_;
      auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar9),
                               ZEXT416(0x3e679a0b));
      auVar4 = vfmadd213ss_fma(auVar4,ZEXT416((uint)fVar9),ZEXT416(0x3f321004));
      auVar4 = vfmadd213ss_fma(auVar4,ZEXT416((uint)fVar9),ZEXT416(0x3f800000));
      iVar1 = (int)auVar8._0_4_ + -0x7f + (auVar4._0_4_ >> 0x17);
      fVar9 = -1.0;
      if ((-0x7f < iVar1) && (fVar9 = INFINITY, iVar1 < 0x80)) {
        fVar9 = (float)(iVar1 * 0x800000 + 0x3f800000U | auVar4._0_4_ & 0x807fffff) + -1.0;
      }
      fVar9 = 1.1910428e-16 / (fVar3 * fVar3 * fVar3 * fVar3 * fVar3 * fVar9);
      if (NAN(fVar9)) {
LAB_002fa623:
        pbrt::LogFatal<char_const(&)[11]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum.h"
                   ,0x4b,"Check failed: %s",(char (*) [11])"!IsNaN(Le)");
      }
      local_68.ptr_._0_4_ = fVar9;
      if (iVar2 < 1) goto LAB_002fa301;
      fVar3 = local_3c * 1e-09;
      fVar9 = (1.9864457e-25 / (fVar3 * 1.3806487e-23 * local_54)) * 1.442695;
      auVar8 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
      fVar9 = fVar9 - auVar8._0_4_;
      auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar9),
                               ZEXT416(0x3e679a0b));
      auVar4 = vfmadd213ss_fma(auVar4,ZEXT416((uint)fVar9),ZEXT416(0x3f321004));
      auVar4 = vfmadd213ss_fma(auVar4,ZEXT416((uint)fVar9),ZEXT416(0x3f800000));
      iVar1 = (int)auVar8._0_4_ + -0x7f + (auVar4._0_4_ >> 0x17);
      fVar9 = -1.0;
      if ((-0x7f < iVar1) && (fVar9 = INFINITY, iVar1 < 0x80)) {
        fVar9 = (float)(iVar1 * 0x800000 + 0x3f800000U | auVar4._0_4_ & 0x807fffff) + -1.0;
      }
      fVar9 = 1.1910428e-16 / (fVar3 * fVar3 * fVar3 * fVar3 * fVar3 * fVar9);
      if (NAN(fVar9)) goto LAB_002fa623;
    }
    local_60[0] = fVar9;
    testing::internal::CmpHelperLT<float,float>
              (local_50,"Blackbody(lambda[0], T)","Blackbody(lambda[1], T)",(float *)&local_68,
               local_60);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      pcVar7 = "";
      if (local_48.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_48.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum_test.cpp"
                 ,0x2d,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar2 < 1) {
      local_68.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((ulong)local_68.ptr_._4_4_ << 0x20);
LAB_002fa55d:
      fVar9 = 0.0;
    }
    else {
      fVar3 = local_3c * 1e-09;
      fVar9 = (1.9864457e-25 / (fVar3 * 1.3806487e-23 * local_54)) * 1.442695;
      auVar8 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
      fVar9 = fVar9 - auVar8._0_4_;
      auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar9),
                               ZEXT416(0x3e679a0b));
      auVar4 = vfmadd213ss_fma(auVar4,ZEXT416((uint)fVar9),ZEXT416(0x3f321004));
      auVar4 = vfmadd213ss_fma(auVar4,ZEXT416((uint)fVar9),ZEXT416(0x3f800000));
      iVar1 = (int)auVar8._0_4_ + -0x7f + (auVar4._0_4_ >> 0x17);
      fVar9 = -1.0;
      if ((-0x7f < iVar1) && (fVar9 = INFINITY, iVar1 < 0x80)) {
        fVar9 = (float)(iVar1 * 0x800000 + 0x3f800000U | auVar4._0_4_ & 0x807fffff) + -1.0;
      }
      fVar9 = 1.1910428e-16 / (fVar3 * fVar3 * fVar3 * fVar3 * fVar3 * fVar9);
      if (NAN(fVar9)) goto LAB_002fa623;
      local_68.ptr_._0_4_ = fVar9;
      if (iVar2 < 1) goto LAB_002fa55d;
      fVar3 = (float)local_38 * 1e-09;
      fVar9 = (1.9864457e-25 / (fVar3 * 1.3806487e-23 * local_54)) * 1.442695;
      auVar8 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
      fVar9 = fVar9 - auVar8._0_4_;
      auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar9),
                               ZEXT416(0x3e679a0b));
      auVar4 = vfmadd213ss_fma(auVar4,ZEXT416((uint)fVar9),ZEXT416(0x3f321004));
      auVar4 = vfmadd213ss_fma(auVar4,ZEXT416((uint)fVar9),ZEXT416(0x3f800000));
      iVar2 = (int)auVar8._0_4_ + -0x7f + (auVar4._0_4_ >> 0x17);
      fVar9 = -1.0;
      if ((-0x7f < iVar2) && (fVar9 = INFINITY, iVar2 < 0x80)) {
        fVar9 = (float)(iVar2 * 0x800000 + 0x3f800000U | auVar4._0_4_ & 0x807fffff) + -1.0;
      }
      fVar9 = 1.1910428e-16 / (fVar3 * fVar3 * fVar3 * fVar3 * fVar3 * fVar9);
      if (NAN(fVar9)) goto LAB_002fa623;
    }
    local_60[0] = fVar9;
    testing::internal::CmpHelperGT<float,float>
              (local_50,"Blackbody(lambda[1], T)","Blackbody(lambda[2], T)",(float *)&local_68,
               local_60);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      pcVar7 = "";
      if (local_48.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_48.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum_test.cpp"
                 ,0x2e,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar6 = lVar6 + 4;
    if (lVar6 == 0x14) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Spectrum, Blackbody) {
    // Relative error.
    auto err = [](Float val, Float ref) { return std::abs(val - ref) / ref; };

    // Planck's law.
    // A few values via
    // http://www.spectralcalc.com/blackbody_calculator/blackbody.php
    // lambda, T, expected radiance
    Float v[][3] = {
        {483, 6000, 3.1849e13},
        {600, 6000, 2.86772e13},
        {500, 3700, 1.59845e12},
        {600, 4500, 7.46497e12},
    };
    int n = PBRT_ARRAYSIZE(v);
    for (int i = 0; i < n; ++i) {
        Float lambda = v[i][0], T = v[i][1], LeExpected = v[i][2];
        EXPECT_LT(err(Blackbody(lambda, T), LeExpected), .001);
    }

    // Use Wien's displacement law to compute maximum wavelength for a few
    // temperatures, then confirm that the value returned by Blackbody() is
    // consistent with this.
    for (Float T : {2700, 3000, 4500, 5600, 6000}) {
        Float lambdaMax = 2.8977721e-3 / T * 1e9;
        Float lambda[3] = {Float(.99 * lambdaMax), lambdaMax, Float(1.01 * lambdaMax)};
        EXPECT_LT(Blackbody(lambda[0], T), Blackbody(lambda[1], T));
        EXPECT_GT(Blackbody(lambda[1], T), Blackbody(lambda[2], T));
    }
}